

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  void *pvVar4;
  void *pvVar5;
  xml_attribute_struct *pxVar6;
  xml_node_struct *pxVar7;
  xml_node_struct *pxVar8;
  xml_node_struct *pxVar9;
  xml_node_struct *rn;
  xml_node_struct *ln;
  
  pvVar4 = document_buffer_order((xpath_node *)this);
  pvVar5 = document_buffer_order(lhs);
  if (pvVar5 != (void *)0x0 && pvVar4 != (void *)0x0) {
    return pvVar4 < pvVar5;
  }
  pxVar8 = *(xml_node_struct **)this;
  pxVar6 = *(xml_attribute_struct **)(this + 8);
  pxVar9 = (lhs->_node)._root;
  pxVar1 = (lhs->_attribute)._attr;
  if (pxVar6 == (xml_attribute_struct *)0x0) {
    if (pxVar1 != (xml_attribute_struct *)0x0 && pxVar9 == pxVar8) {
      return true;
    }
  }
  else if ((pxVar1 != (xml_attribute_struct *)0x0) && (pxVar8 == pxVar9)) {
    for (; (pxVar6 != (xml_attribute_struct *)0x0 && (pxVar6 != pxVar1));
        pxVar6 = pxVar6->next_attribute) {
    }
    return pxVar6 != (xml_attribute_struct *)0x0;
  }
  if (pxVar8 == pxVar9) {
    return false;
  }
  pxVar7 = pxVar8;
  pxVar2 = pxVar9;
  if (pxVar9 == (xml_node_struct *)0x0 || pxVar8 == (xml_node_struct *)0x0) {
    return pxVar8 < pxVar9;
  }
  do {
    rn = pxVar2;
    ln = pxVar7;
    pxVar7 = ln;
    if ((ln == (xml_node_struct *)0x0) || (rn == (xml_node_struct *)0x0)) goto LAB_0012add7;
    pxVar7 = ln->parent;
    pxVar2 = rn->parent;
  } while (ln->parent != rn->parent);
LAB_0012ae11:
  bVar3 = node_is_before_sibling(ln,rn);
  return bVar3;
LAB_0012add7:
  for (; pxVar7 != (xml_node_struct *)0x0; pxVar7 = pxVar7->parent) {
    pxVar8 = pxVar8->parent;
  }
  for (; rn != (xml_node_struct *)0x0; rn = rn->parent) {
    pxVar9 = pxVar9->parent;
  }
  if (pxVar8 == pxVar9) {
    return ln == (xml_node_struct *)0x0;
  }
  do {
    rn = pxVar9;
    ln = pxVar8;
    pxVar8 = ln->parent;
    pxVar9 = rn->parent;
  } while (ln->parent != rn->parent);
  goto LAB_0012ae11;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}